

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

uint32_t cpu_ldl_data_ra_s390x(CPUArchState_conflict29 *env,target_ulong ptr,uintptr_t retaddr)

{
  ulong uVar1;
  uint64_t uVar2;
  TCGMemOpIdx oi;
  
  uVar1 = (env->psw).mask;
  oi = 0xa3;
  if ((uVar1 >> 0x3a & 1) != 0) {
    switch((uint)(uVar1 >> 0x2e) & 3) {
    case 0:
      oi = 0xa0;
      break;
    case 1:
      abort();
    case 2:
      oi = 0xa1;
      break;
    case 3:
      oi = 0xa2;
    }
  }
  uVar2 = load_helper(env,ptr,oi,retaddr,MO_BEUL,false,full_be_ldul_mmu);
  return (uint32_t)uVar2;
}

Assistant:

uint32_t cpu_ldl_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldl_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}